

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

void iCopyColors<cRGBT,cBGRA,bAdd>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  byte bVar1;
  EBlend EVar2;
  FSpecialColormap *pFVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  BYTE BVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  byte bVar15;
  byte *pbVar16;
  
  pFVar3 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
switchD_0058a9f2_caseD_0:
    lVar8 = 0;
    if (count < 1) {
      count = 0;
    }
    pbVar16 = pin + 2;
    for (; count != (int)lVar8; lVar8 = lVar8 + 1) {
      if (((pbVar16[-2] != tr) || (pbVar16[-1] != tg)) || (*pbVar16 != tb)) {
        iVar13 = (int)((uint)pbVar16[-2] * inf->alpha + (uint)pout[lVar8 * 4 + 2] * 0x10000) >> 0x10
        ;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar8 * 4 + 2] = (BYTE)iVar13;
        iVar13 = (int)((uint)pbVar16[-1] * inf->alpha + (uint)pout[lVar8 * 4 + 1] * 0x10000) >> 0x10
        ;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar8 * 4 + 1] = (BYTE)iVar13;
        iVar13 = (int)((uint)*pbVar16 * inf->alpha + (uint)pout[lVar8 * 4] * 0x10000) >> 0x10;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        pout[lVar8 * 4] = (BYTE)iVar13;
        pout[lVar8 * 4 + 3] = 0xff;
      }
      pbVar16 = pbVar16 + step;
    }
  }
  else {
    switch(inf->blend) {
    case BLEND_NONE:
      goto switchD_0058a9f2_caseD_0;
    case BLEND_ICEMAP:
      lVar8 = 0;
      if (count < 1) {
        count = 0;
      }
      for (; count != (int)lVar8; lVar8 = lVar8 + 1) {
        if (((*pin != tr) || (pin[1] != tg)) || (pin[2] != tb)) {
          iVar13 = cRGBT::Gray(pin);
          iVar13 = iVar13 >> 4;
          iVar5 = (int)((uint)IcePalette[iVar13][0] * inf->alpha +
                       (uint)pout[lVar8 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pout[lVar8 * 4 + 2] = (BYTE)iVar5;
          iVar5 = (int)((uint)IcePalette[iVar13][1] * inf->alpha +
                       (uint)pout[lVar8 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          pout[lVar8 * 4 + 1] = (BYTE)iVar5;
          iVar13 = (int)((uint)IcePalette[iVar13][2] * inf->alpha + (uint)pout[lVar8 * 4] * 0x10000)
                   >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar8 * 4] = (BYTE)iVar13;
          pout[lVar8 * 4 + 3] = 0xff;
        }
        pin = pin + step;
      }
      break;
    case BLEND_OVERLAY:
      lVar8 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar16 = pin + 2;
      for (; count != (int)lVar8; lVar8 = lVar8 + 1) {
        bVar15 = pbVar16[-1];
        if ((pbVar16[-1] != tg || pbVar16[-2] != tr) || (bVar15 = tg, *pbVar16 != tb)) {
          iVar13 = inf->blendcolor[3];
          iVar5 = inf->blendcolor[1];
          bVar1 = *pbVar16;
          iVar14 = inf->blendcolor[2];
          iVar12 = ((uint)pbVar16[-2] * iVar13 + inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar8 * 4 + 2] * 0x10000;
          BVar11 = (BYTE)((uint)iVar12 >> 0x10);
          if (0xfe < iVar12 >> 0x10) {
            BVar11 = 0xff;
          }
          pout[lVar8 * 4 + 2] = BVar11;
          iVar5 = ((uint)bVar15 * iVar13 + iVar5 >> 0x10 & 0xff) * inf->alpha +
                  (uint)pout[lVar8 * 4 + 1] * 0x10000;
          BVar11 = (BYTE)((uint)iVar5 >> 0x10);
          if (0xfe < iVar5 >> 0x10) {
            BVar11 = 0xff;
          }
          pout[lVar8 * 4 + 1] = BVar11;
          iVar13 = ((uint)bVar1 * iVar13 + iVar14 >> 0x10 & 0xff) * inf->alpha +
                   (uint)pout[lVar8 * 4] * 0x10000;
          BVar11 = (BYTE)((uint)iVar13 >> 0x10);
          if (0xfe < iVar13 >> 0x10) {
            BVar11 = 0xff;
          }
          pout[lVar8 * 4] = BVar11;
          pout[lVar8 * 4 + 3] = 0xff;
        }
        pbVar16 = pbVar16 + step;
      }
      break;
    case BLEND_MODULATE:
      lVar8 = 0;
      if (count < 1) {
        count = 0;
      }
      pbVar16 = pin + 2;
      for (; count != (int)lVar8; lVar8 = lVar8 + 1) {
        bVar15 = pbVar16[-1];
        if ((pbVar16[-1] != tg || pbVar16[-2] != tr) || (bVar15 = tg, *pbVar16 != tb)) {
          iVar13 = (int)(((uint)pbVar16[-2] * inf->blendcolor[0] >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar8 * 4 + 2] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          iVar5 = inf->blendcolor[1];
          bVar1 = *pbVar16;
          iVar14 = inf->blendcolor[2];
          pout[lVar8 * 4 + 2] = (BYTE)iVar13;
          iVar13 = (int)(((uint)bVar15 * iVar5 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar8 * 4 + 1] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar8 * 4 + 1] = (BYTE)iVar13;
          iVar13 = (int)(((uint)bVar1 * iVar14 >> 0x10 & 0xff) * inf->alpha +
                        (uint)pout[lVar8 * 4] * 0x10000) >> 0x10;
          if (0xfe < iVar13) {
            iVar13 = 0xff;
          }
          pout[lVar8 * 4] = (BYTE)iVar13;
          pout[lVar8 * 4 + 3] = 0xff;
        }
        pbVar16 = pbVar16 + step;
      }
      break;
    default:
      EVar2 = inf->blend;
      lVar8 = (long)EVar2;
      if (lVar8 < 0x21) {
        if (BLEND_ICEMAP < EVar2) {
          iVar13 = 0x20 - EVar2;
          uVar10 = 0;
          uVar7 = (ulong)(uint)count;
          if (count < 1) {
            uVar7 = uVar10;
          }
          for (; (int)uVar7 != (int)uVar10; uVar10 = uVar10 + 1) {
            if (((*pin != tr) || (pin[1] != tg)) || (pin[2] != tb)) {
              iVar5 = cRGBT::Gray(pin);
              iVar5 = iVar5 * (EVar2 + BLEND_MODULATE);
              bVar15 = pin[1];
              bVar1 = pin[2];
              iVar14 = ((int)((uint)*pin * iVar13 + iVar5) / 0x1f & 0xffU) * inf->alpha +
                       (uint)pout[uVar10 * 4 + 2] * 0x10000;
              BVar11 = (BYTE)((uint)iVar14 >> 0x10);
              if (0xfe < iVar14 >> 0x10) {
                BVar11 = 0xff;
              }
              pout[uVar10 * 4 + 2] = BVar11;
              iVar14 = ((int)((uint)bVar15 * iVar13 + iVar5) / 0x1f & 0xffU) * inf->alpha +
                       (uint)pout[uVar10 * 4 + 1] * 0x10000;
              BVar11 = (BYTE)((uint)iVar14 >> 0x10);
              if (0xfe < iVar14 >> 0x10) {
                BVar11 = 0xff;
              }
              pout[uVar10 * 4 + 1] = BVar11;
              iVar5 = ((int)((uint)bVar1 * iVar13 + iVar5) / 0x1f & 0xffU) * inf->alpha +
                      (uint)pout[uVar10 * 4] * 0x10000;
              BVar11 = (BYTE)((uint)iVar5 >> 0x10);
              if (0xfe < iVar5 >> 0x10) {
                BVar11 = 0xff;
              }
              pout[uVar10 * 4] = BVar11;
              pout[uVar10 * 4 + 3] = 0xff;
            }
            pin = pin + step;
          }
        }
      }
      else {
        if (count < 1) {
          count = 0;
        }
        for (lVar9 = 0; count != (int)lVar9; lVar9 = lVar9 + 1) {
          if (((*pin != tr) || (pin[1] != tg)) || (pin[2] != tb)) {
            uVar4 = cRGBT::Gray(pin);
            uVar6 = 0xff;
            if (uVar4 < 0xff) {
              uVar6 = uVar4;
            }
            if ((int)uVar4 < 1) {
              uVar6 = 0;
            }
            uVar7 = (ulong)uVar6;
            iVar13 = (int)((uint)*(byte *)((long)pFVar3 + uVar7 * 4 + lVar8 * 0x518 + -0xa6fe) *
                           inf->alpha + (uint)pout[lVar9 * 4 + 2] * 0x10000) >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            bVar15 = *(byte *)((long)pFVar3 + uVar7 * 4 + lVar8 * 0x518 + -0xa700);
            bVar1 = *(byte *)((long)pFVar3 + uVar7 * 4 + lVar8 * 0x518 + -0xa6ff);
            pout[lVar9 * 4 + 2] = (BYTE)iVar13;
            iVar13 = (int)((uint)bVar1 * inf->alpha + (uint)pout[lVar9 * 4 + 1] * 0x10000) >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pout[lVar9 * 4 + 1] = (BYTE)iVar13;
            iVar13 = (int)((uint)bVar15 * inf->alpha + (uint)pout[lVar9 * 4] * 0x10000) >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            pout[lVar9 * 4] = (BYTE)iVar13;
            pout[lVar9 * 4 + 3] = 0xff;
          }
          pin = pin + step;
        }
      }
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}